

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter_tree.cc
# Opt level: O0

void __thiscall re2::PrefilterTree::Add(PrefilterTree *this,Prefilter *f)

{
  value_type pPVar1;
  bool bVar2;
  ostream *poVar3;
  LogMessage local_198;
  value_type local_18;
  Prefilter *f_local;
  PrefilterTree *this_local;
  
  local_18 = f;
  f_local = (Prefilter *)this;
  if ((this->compiled_ & 1U) == 0) {
    if (f != (Prefilter *)0x0) {
      bVar2 = KeepPart(f,0);
      pPVar1 = local_18;
      if (!bVar2) {
        if (local_18 != (Prefilter *)0x0) {
          Prefilter::~Prefilter(local_18);
          operator_delete(pPVar1);
        }
        local_18 = (Prefilter *)0x0;
      }
    }
    std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::push_back
              (&this->prefilter_vec_,&local_18);
  }
  else {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prefilter_tree.cc"
               ,0x47);
    poVar3 = LogMessage::stream(&local_198);
    std::operator<<(poVar3,"Add after Compile.");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  return;
}

Assistant:

void PrefilterTree::Add(Prefilter *f) {
  if (compiled_) {
    LOG(DFATAL) << "Add after Compile.";
    return;
  }
  if (f != NULL && !KeepPart(f, 0)) {
    delete f;
    f = NULL;
  }

  prefilter_vec_.push_back(f);
}